

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  int iVar1;
  secp256k1_fe *in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_gej *in_stack_fffffffffffffe30;
  secp256k1_fe local_1b0 [2];
  secp256k1_fe *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_fffffffffffffec8;
  secp256k1_gej *in_stack_fffffffffffffed0;
  secp256k1_fe local_110;
  secp256k1_fe local_e8;
  secp256k1_fe local_c0;
  secp256k1_fe local_98;
  secp256k1_fe local_70 [2];
  secp256k1_fe *local_20;
  void *local_10;
  secp256k1_fe *local_8;
  
  if (*(int *)((long)in_RSI + 0x78) == 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (*(int *)(in_RDX + 0x50) == 0) {
      *(undefined4 *)in_RDI[3].n = 0;
      local_20 = in_RCX;
      secp256k1_fe_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
      memcpy(local_70,local_10,0x28);
      secp256k1_fe_normalize_weak(local_70);
      secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                       (secp256k1_fe *)0x10c4c7);
      memcpy(&local_c0,(void *)((long)local_10 + 0x28),0x28);
      secp256k1_fe_normalize_weak(&local_c0);
      secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                       (secp256k1_fe *)0x10c513);
      secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                       (secp256k1_fe *)0x10c52f);
      secp256k1_fe_negate(&local_110,local_70,1);
      secp256k1_fe_add(&local_110,&local_98);
      secp256k1_fe_negate((secp256k1_fe *)&stack0xfffffffffffffec8,&local_c0,1);
      secp256k1_fe_add((secp256k1_fe *)&stack0xfffffffffffffec8,&local_e8);
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&local_110);
      if (iVar1 == 0) {
        secp256k1_fe_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
        secp256k1_fe_sqr(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x);
        secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                         (secp256k1_fe *)0x10c639);
        if (local_20 != (secp256k1_fe *)0x0) {
          memcpy(local_20,&local_110,0x28);
        }
        secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                         (secp256k1_fe *)0x10c683);
        secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                         (secp256k1_fe *)0x10c698);
        memcpy(local_8,&stack0xfffffffffffffe28,0x28);
        secp256k1_fe_mul_int(local_8,2);
        secp256k1_fe_add(local_8,local_1b0);
        secp256k1_fe_negate(local_8,local_8,3);
        secp256k1_fe_add(local_8,(secp256k1_fe *)&stack0xfffffffffffffea0);
        secp256k1_fe_negate(local_8 + 1,local_8,5);
        secp256k1_fe_add(local_8 + 1,(secp256k1_fe *)&stack0xfffffffffffffe28);
        secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                         (secp256k1_fe *)0x10c754);
        secp256k1_fe_mul(&in_stack_fffffffffffffe30->x,&in_stack_fffffffffffffe28->x,
                         (secp256k1_fe *)0x10c769);
        secp256k1_fe_negate(local_1b0,local_1b0,1);
        secp256k1_fe_add(local_8 + 1,local_1b0);
      }
      else {
        iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)&stack0xfffffffffffffec8);
        if (iVar1 == 0) {
          if (local_20 != (secp256k1_fe *)0x0) {
            secp256k1_fe_set_int(local_20,0);
          }
          *(undefined4 *)local_8[3].n = 1;
        }
        else {
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        }
      }
    }
    else {
      if (in_RCX != (secp256k1_fe *)0x0) {
        secp256k1_fe_set_int(in_RCX,1);
      }
      memcpy(local_8,local_10,0x80);
    }
  }
  else {
    secp256k1_gej_set_ge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* 8 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }
    r->infinity = 0;

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}